

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O0

QLayoutItem * __thiscall
QBoxLayoutPrivate::replaceAt(QBoxLayoutPrivate *this,int index,QLayoutItem *item)

{
  QBoxLayout *pQVar1;
  QBoxLayoutItem *pQVar2;
  QLayoutItem *in_RDX;
  QBoxLayoutPrivate *in_RDI;
  QLayoutItem *r;
  QBoxLayoutItem *b;
  QBoxLayout *q;
  qsizetype in_stack_ffffffffffffffb8;
  QLayoutItem *local_8;
  
  pQVar1 = q_func(in_RDI);
  if (in_RDX == (QLayoutItem *)0x0) {
    local_8 = (QLayoutItem *)0x0;
  }
  else {
    pQVar2 = QList<QBoxLayoutItem_*>::value
                       ((QList<QBoxLayoutItem_*> *)in_RDI,in_stack_ffffffffffffffb8);
    if (pQVar2 == (QBoxLayoutItem *)0x0) {
      local_8 = (QLayoutItem *)0x0;
    }
    else {
      local_8 = pQVar2->item;
      pQVar2->item = in_RDX;
      (**(code **)(*(long *)&pQVar1->super_QLayout + 0x70))();
    }
  }
  return local_8;
}

Assistant:

QLayoutItem* QBoxLayoutPrivate::replaceAt(int index, QLayoutItem *item)
{
    Q_Q(QBoxLayout);
    if (!item)
        return nullptr;
    QBoxLayoutItem *b = list.value(index);
    if (!b)
        return nullptr;
    QLayoutItem *r = b->item;

    b->item = item;
    q->invalidate();
    return r;
}